

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

int my_numbox_check_minmax(t_my_numbox *x,double min,double max)

{
  bool bVar1;
  double dVar2;
  uint local_24;
  double dStack_20;
  int ret;
  double max_local;
  double min_local;
  t_my_numbox *x_local;
  
  dStack_20 = max;
  max_local = min;
  if (x->x_lin0_log1 != 0) {
    if ((((min == 0.0) && (!NAN(min))) && (max == 0.0)) && (!NAN(max))) {
      dStack_20 = 1.0;
    }
    if (dStack_20 <= 0.0) {
      if (0.0 < min) {
        dStack_20 = min * 0.01;
      }
    }
    else if (min <= 0.0) {
      max_local = dStack_20 * 0.01;
    }
  }
  x->x_min = max_local;
  x->x_max = dStack_20;
  bVar1 = (double)x->x_val < x->x_min;
  if (bVar1) {
    x->x_val = (float)x->x_min;
  }
  local_24 = (uint)bVar1;
  if (x->x_max <= (double)x->x_val && (double)x->x_val != x->x_max) {
    x->x_val = (float)x->x_max;
    local_24 = 1;
  }
  if (x->x_lin0_log1 == 0) {
    x->x_k = 1.0;
  }
  else {
    dVar2 = log(x->x_max / x->x_min);
    dVar2 = exp(dVar2 / (double)x->x_log_height);
    x->x_k = dVar2;
  }
  return local_24;
}

Assistant:

int my_numbox_check_minmax(t_my_numbox *x, double min, double max)
{
    int ret = 0;

    if(x->x_lin0_log1)
    {
        if((min == 0.0) && (max == 0.0))
            max = 1.0;
        if(max > 0.0)
        {
            if(min <= 0.0)
                min = 0.01 * max;
        }
        else
        {
            if(min > 0.0)
                max = 0.01 * min;
        }
    }
    x->x_min = min;
    x->x_max = max;
    if(x->x_val < x->x_min)
    {
        x->x_val = x->x_min;
        ret = 1;
    }
    if(x->x_val > x->x_max)
    {
        x->x_val = x->x_max;
        ret = 1;
    }
    if(x->x_lin0_log1)
        x->x_k = exp(log(x->x_max/x->x_min) / (double)(x->x_log_height));
    else
        x->x_k = 1.0;
    return(ret);
}